

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location,
          FileDescriptorProto *containing_file)

{
  int iVar1;
  Rep *pRVar2;
  Tokenizer *pTVar3;
  ulong uVar4;
  SourceCodeInfo *pSVar5;
  FileDescriptorProto *containing_file_00;
  bool bVar6;
  int iVar7;
  DescriptorProto_ExtensionRange *obj;
  Message *descriptor;
  Type *pTVar8;
  ExtensionRangeOptions *pEVar9;
  undefined7 extraout_var;
  ExtensionRangeOptions *pEVar10;
  Type *pTVar11;
  SourceCodeInfo_Location *pSVar12;
  uint uVar13;
  undefined4 uVar14;
  int index;
  Arena *pAVar15;
  int end;
  int start;
  LocationRecorder start_location;
  Token start_token;
  LocationRecorder location;
  int local_d4;
  ulong local_d0;
  int local_c4;
  LocationRecorder *local_c0;
  RepeatedPtrFieldBase *local_b8;
  FileDescriptorProto *local_b0;
  ulong local_a8;
  DescriptorProto *local_a0;
  LocationRecorder local_98;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [32];
  ColumnNumber local_50;
  LocationRecorder local_48;
  
  local_c0 = extensions_location;
  bVar6 = Consume(this,"extensions");
  if (bVar6) {
    local_d0 = (ulong)(uint)(message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
    local_b8 = &(message->extension_range_).super_RepeatedPtrFieldBase;
    local_b0 = containing_file;
    local_a0 = message;
    do {
      LocationRecorder::LocationRecorder
                (&local_48,local_c0,
                 (message->extension_range_).super_RepeatedPtrFieldBase.current_size_);
      pRVar2 = (message->extension_range_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar2 == (Rep *)0x0) {
LAB_00342fba:
        obj = Arena::CreateMaybeMessage<google::protobuf::DescriptorProto_ExtensionRange>
                        (((RepeatedPtrFieldBase *)&local_b8->arena_)->arena_);
        descriptor = (Message *)internal::RepeatedPtrFieldBase::AddOutOfLineHelper(local_b8,obj);
      }
      else {
        iVar7 = (message->extension_range_).super_RepeatedPtrFieldBase.current_size_;
        if (pRVar2->allocated_size <= iVar7) goto LAB_00342fba;
        (message->extension_range_).super_RepeatedPtrFieldBase.current_size_ = iVar7 + 1;
        descriptor = (Message *)pRVar2->elements[iVar7];
      }
      LocationRecorder::RecordLegacyLocation(&local_48,descriptor,NUMBER);
      local_78._M_p = local_70 + 8;
      local_70._0_8_ = (Arena *)0x0;
      local_70._8_4_ = local_70._8_4_ & 0xffffff00;
      LocationRecorder::LocationRecorder(&local_98,&local_48,1);
      pTVar3 = this->input_;
      local_80._0_4_ = (pTVar3->current_).type;
      std::__cxx11::string::_M_assign((string *)&local_78);
      local_50 = (pTVar3->current_).end_column;
      local_70._24_4_ = (pTVar3->current_).line;
      local_70._28_4_ = (pTVar3->current_).column;
      bVar6 = ConsumeInteger(this,&local_c4,"Expected field number range.");
      LocationRecorder::~LocationRecorder(&local_98);
      if (!bVar6) {
LAB_003432ef:
        if (local_78._M_p != local_70 + 8) {
          operator_delete(local_78._M_p);
        }
        LocationRecorder::~LocationRecorder(&local_48);
        return false;
      }
      bVar6 = TryConsume(this,"to");
      message = local_a0;
      if (bVar6) {
        LocationRecorder::LocationRecorder(&local_98,&local_48,2);
        bVar6 = TryConsume(this,"max");
        if (bVar6) {
          local_d4 = -2;
        }
        else {
          bVar6 = ConsumeInteger(this,&local_d4,"Expected integer.");
          if (!bVar6) {
            LocationRecorder::~LocationRecorder(&local_98);
            goto LAB_003432ef;
          }
        }
      }
      else {
        LocationRecorder::LocationRecorder(&local_98,&local_48,2);
        LocationRecorder::StartAt(&local_98,(Token *)local_80);
        LocationRecorder::EndAt(&local_98,(Token *)local_80);
        local_d4 = local_c4;
      }
      LocationRecorder::~LocationRecorder(&local_98);
      local_d4 = local_d4 + 1;
      *(int *)&descriptor[2].super_MessageLite._vptr_MessageLite = local_c4;
      *(uint *)&descriptor[1].super_MessageLite._vptr_MessageLite =
           *(uint *)&descriptor[1].super_MessageLite._vptr_MessageLite | 6;
      *(int *)((long)&descriptor[2].super_MessageLite._vptr_MessageLite + 4) = local_d4;
      if (local_78._M_p != local_70 + 8) {
        operator_delete(local_78._M_p);
      }
      LocationRecorder::~LocationRecorder(&local_48);
      bVar6 = TryConsume(this,",");
    } while (bVar6);
    iVar7 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar7 != 0) {
LAB_00343164:
      bVar6 = ConsumeEndOfDeclaration(this,";",local_c0);
      return bVar6;
    }
    local_a8 = (ulong)(uint)(local_c0->location_->path_).current_size_;
    SourceCodeInfo::SourceCodeInfo((SourceCodeInfo *)local_80,(Arena *)0x0,false);
    pTVar8 = internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                       (local_b8,(int)local_d0);
    containing_file_00 = local_b0;
    *(byte *)(pTVar8->_has_bits_).has_bits_ = (byte)(pTVar8->_has_bits_).has_bits_[0] | 1;
    if (pTVar8->options_ == (ExtensionRangeOptions *)0x0) {
      uVar4 = (pTVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
      pAVar15 = (Arena *)(uVar4 & 0xfffffffffffffffc);
      if ((uVar4 & 1) != 0) {
        pAVar15 = *(Arena **)pAVar15;
      }
      pEVar9 = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(pAVar15);
      pTVar8->options_ = pEVar9;
    }
    pEVar9 = pTVar8->options_;
    LocationRecorder::LocationRecorder(&local_48,local_c0,0,(SourceCodeInfo *)local_80);
    LocationRecorder::LocationRecorder(&local_98,&local_48,3);
    bVar6 = Consume(this,"[");
    if (bVar6) {
      do {
        bVar6 = ParseOption(this,&pEVar9->super_Message,&local_98,containing_file_00,
                            OPTION_ASSIGNMENT);
        if (!bVar6) goto LAB_00343267;
        bVar6 = TryConsume(this,",");
      } while (bVar6);
      bVar6 = Consume(this,"]");
      uVar14 = (undefined4)CONCAT71(extraout_var,bVar6);
    }
    else {
LAB_00343267:
      uVar14 = 0;
    }
    LocationRecorder::~LocationRecorder(&local_98);
    LocationRecorder::~LocationRecorder(&local_48);
    if ((char)uVar14 == '\0') {
      SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_80);
    }
    else {
      local_b0 = (FileDescriptorProto *)CONCAT44(local_b0._4_4_,uVar14);
      iVar7 = (int)local_d0;
      while (iVar7 = iVar7 + 1,
            iVar7 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
        pTVar8 = internal::RepeatedPtrFieldBase::
                 Mutable<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                           (local_b8,iVar7);
        *(byte *)(pTVar8->_has_bits_).has_bits_ = (byte)(pTVar8->_has_bits_).has_bits_[0] | 1;
        if (pTVar8->options_ == (ExtensionRangeOptions *)0x0) {
          uVar4 = (pTVar8->super_Message).super_MessageLite._internal_metadata_.ptr_;
          pAVar15 = (Arena *)(uVar4 & 0xfffffffffffffffc);
          if ((uVar4 & 1) != 0) {
            pAVar15 = *(Arena **)pAVar15;
          }
          pEVar10 = Arena::CreateMaybeMessage<google::protobuf::ExtensionRangeOptions>(pAVar15);
          pTVar8->options_ = pEVar10;
        }
        ExtensionRangeOptions::CopyFrom(pTVar8->options_,pEVar9);
      }
      if ((int)local_d0 < (message->extension_range_).super_RepeatedPtrFieldBase.current_size_) {
        iVar7 = (int)local_a8;
        do {
          if (0 < (int)local_70._8_4_) {
            index = 0;
            do {
              pTVar11 = internal::RepeatedPtrFieldBase::
                        Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                                  ((RepeatedPtrFieldBase *)local_70,index);
              if ((pTVar11->path_).current_size_ != iVar7 + 1) {
                pSVar5 = this->source_code_info_;
                pRVar2 = (pSVar5->location_).super_RepeatedPtrFieldBase.rep_;
                if (pRVar2 == (Rep *)0x0) {
LAB_00343394:
                  pSVar12 = Arena::CreateMaybeMessage<google::protobuf::SourceCodeInfo_Location>
                                      ((pSVar5->location_).super_RepeatedPtrFieldBase.arena_);
                  pSVar12 = (SourceCodeInfo_Location *)
                            internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                                      (&(pSVar5->location_).super_RepeatedPtrFieldBase,pSVar12);
                }
                else {
                  iVar1 = (pSVar5->location_).super_RepeatedPtrFieldBase.current_size_;
                  if (pRVar2->allocated_size <= iVar1) goto LAB_00343394;
                  (pSVar5->location_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
                  pSVar12 = (SourceCodeInfo_Location *)pRVar2->elements[iVar1];
                }
                pTVar11 = internal::RepeatedPtrFieldBase::
                          Get<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                                    ((RepeatedPtrFieldBase *)local_70,index);
                SourceCodeInfo_Location::CopyFrom(pSVar12,pTVar11);
                local_48.parser_._0_4_ = (undefined4)local_d0;
                RepeatedField<int>::Set(&pSVar12->path_,(int)local_a8,(int *)&local_48);
              }
              index = index + 1;
            } while (index < (int)local_70._8_4_);
          }
          uVar13 = (int)local_d0 + 1;
          local_d0 = (ulong)uVar13;
        } while ((int)uVar13 < (local_a0->extension_range_).super_RepeatedPtrFieldBase.current_size_
                );
      }
      SourceCodeInfo::~SourceCodeInfo((SourceCodeInfo *)local_80);
      if ((char)local_b0 != '\0') goto LAB_00343164;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location,
                             const FileDescriptorProto* containing_file) {
  // Parse the declaration.
  DO(Consume("extensions"));

  int old_range_size = message->extension_range_size();

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(range,
                                  DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  if (LookingAt("[")) {
    int range_number_index = extensions_location.CurrentPathSize();
    SourceCodeInfo info;

    // Parse extension range options in the first range.
    ExtensionRangeOptions* options =
        message->mutable_extension_range(old_range_size)->mutable_options();

    {
      LocationRecorder index_location(
          extensions_location, 0 /* we fill this in w/ actual index below */,
          &info);
      LocationRecorder location(
          index_location, DescriptorProto::ExtensionRange::kOptionsFieldNumber);
      DO(Consume("["));

      do {
        DO(ParseOption(options, location, containing_file, OPTION_ASSIGNMENT));
      } while (TryConsume(","));

      DO(Consume("]"));
    }

    // Then copy the extension range options to all of the other ranges we've
    // parsed.
    for (int i = old_range_size + 1; i < message->extension_range_size(); i++) {
      message->mutable_extension_range(i)->mutable_options()->CopyFrom(
          *options);
    }
    // and copy source locations to the other ranges, too
    for (int i = old_range_size; i < message->extension_range_size(); i++) {
      for (int j = 0; j < info.location_size(); j++) {
        if (info.location(j).path_size() == range_number_index + 1) {
          // this location's path is up to the extension range index, but
          // doesn't include options; so it's redundant with location above
          continue;
        }
        SourceCodeInfo_Location* dest = source_code_info_->add_location();
        *dest = info.location(j);
        dest->set_path(range_number_index, i);
      }
    }
  }

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}